

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test::
~TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test
          (TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test *this)

{
  TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test *this_local;
  
  ~TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setStrictGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-sggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}